

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O3

GradientStop * __thiscall
lunasvg::SVGStopElement::gradientStop
          (GradientStop *__return_storage_ptr__,SVGStopElement *this,float opacity)

{
  uint uVar1;
  uint6 uVar2;
  float fVar3;
  undefined1 auVar4 [16];
  plutovg_color_t pVar5;
  float fVar6;
  
  fVar3 = opacity * this->m_stop_opacity;
  uVar1 = (this->m_stop_color).m_value;
  fVar6 = 1.0;
  if (fVar3 <= 1.0) {
    fVar6 = fVar3;
  }
  uVar2 = CONCAT24((short)(uVar1 >> 8),uVar1 >> 0x10) & 0xff000000ff;
  __return_storage_ptr__->offset = *(float *)&(this->m_offset).super_SVGProperty.field_0xc;
  auVar4._0_4_ = (float)(int)uVar2;
  auVar4._4_4_ = (float)(ushort)(uVar2 >> 0x20);
  auVar4._8_4_ = (float)((ushort)uVar1 & 0xff);
  auVar4._12_4_ =
       (float)((ushort)(int)((float)(~-(uint)(fVar3 < 0.0) & (uint)fVar6) * (float)(uVar1 >> 0x18))
              & 0xff);
  pVar5 = (plutovg_color_t)divps(auVar4,_DAT_00143c90);
  __return_storage_ptr__->color = pVar5;
  return __return_storage_ptr__;
}

Assistant:

GradientStop SVGStopElement::gradientStop(float opacity) const
{
    Color stopColor = m_stop_color.colorWithAlpha(m_stop_opacity * opacity);
    GradientStop gradientStop = {
        m_offset.value(), { stopColor.redF(), stopColor.greenF(), stopColor.blueF(), stopColor.alphaF() }
    };

    return gradientStop;
}